

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::find_soo<unsigned_long>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *this,key_arg<unsigned_long> *key)

{
  bool bVar1;
  slot_type *slot;
  pair<const_unsigned_long,_unsigned_long> *ts;
  iterator iVar2;
  EqualElement<unsigned_long> local_38;
  key_arg<unsigned_long> *local_28;
  key_arg<unsigned_long> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<unsigned_long> *)this;
  bVar1 = is_soo(this);
  if (!bVar1) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, absl::hash_internal::Hash<unsigned long>, std::equal_to<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = absl::hash_internal::Hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>, K = unsigned long]"
                 );
  }
  bVar1 = empty(this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = eq_ref(this);
    slot = soo_slot(this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,absl::lts_20250127::hash_internal::Hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>::EqualElement<unsigned_long>,std::pair<unsigned_long_const,unsigned_long>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = soo_iterator(this);
      return iVar2;
    }
  }
  iVar2 = end(this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }